

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::divide(WordType *LHS,uint lhsWords,WordType *RHS,uint rhsWords,WordType *Quotient,
                        WordType *Remainder)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint i_2;
  uint uVar5;
  uint *__s;
  uint *__s_00;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  uint i;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int i_6;
  long lVar21;
  bool bVar22;
  uint32_t *local_280;
  uint *local_278;
  uint32_t SPACE [128];
  
  if (lhsWords < rhsWords) {
    __assert_fail("lhsWords >= rhsWords && \"Fractional result\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x581,
                  "static void llvm::APInt::divide(const WordType *, unsigned int, const WordType *, unsigned int, WordType *, WordType *)"
                 );
  }
  uVar5 = rhsWords * 2;
  uVar9 = lhsWords * 2;
  uVar14 = lhsWords * 2 + 1;
  uVar18 = (ulong)uVar14;
  uVar17 = (ulong)uVar9;
  uVar6 = (ulong)uVar5;
  if ((4 - (uint)(Remainder == (WordType *)0x0)) * uVar5 + (uVar9 + rhsWords * -2) * 2 + 1 < 0x81) {
    uVar5 = uVar5 + uVar14;
    __s_00 = SPACE + uVar18;
    local_278 = SPACE + uVar5;
    __s = SPACE;
    if (Remainder == (WordType *)0x0) {
      local_280 = (uint32_t *)0x0;
    }
    else {
      local_280 = SPACE + (uVar5 + uVar9);
    }
  }
  else {
    __s = (uint *)operator_new__(uVar18 * 4);
    __s_00 = (uint *)operator_new__(uVar6 * 4);
    local_278 = (uint *)operator_new__(uVar17 * 4);
    if (Remainder == (WordType *)0x0) {
      local_280 = (uint32_t *)0x0;
    }
    else {
      local_280 = (uint32_t *)operator_new__(uVar6 * 4);
    }
  }
  memset(__s,0,uVar18 << 2);
  for (uVar18 = 0; (ulong)lhsWords * 2 != uVar18; uVar18 = uVar18 + 2) {
    uVar1 = *(undefined8 *)((long)LHS + uVar18 * 4);
    __s[uVar18 & 0xffffffff] = (uint)uVar1;
    __s[(int)uVar18 + 1] = (uint)((ulong)uVar1 >> 0x20);
  }
  __s[uVar17] = 0;
  memset(__s_00,0,uVar6 * 4);
  for (uVar18 = 0; (ulong)rhsWords * 2 != uVar18; uVar18 = uVar18 + 2) {
    uVar1 = *(undefined8 *)((long)RHS + uVar18 * 4);
    __s_00[uVar18 & 0xffffffff] = (uint)uVar1;
    __s_00[(int)uVar18 + 1] = (uint)((ulong)uVar1 >> 0x20);
  }
  memset(local_278,0,uVar17 << 2);
  if (Remainder != (WordType *)0x0) {
    memset(local_280,0,uVar6 * 4);
  }
  do {
    uVar18 = uVar6;
    if (uVar18 == 0) {
      uVar18 = 0;
      goto LAB_00160f3d;
    }
    uVar6 = uVar18 - 1;
  } while (__s_00[uVar18 - 1] == 0);
  uVar9 = uVar9 - (int)uVar18;
LAB_00160f3d:
  iVar2 = (int)uVar18;
  uVar6 = (ulong)(iVar2 + uVar9);
  while ((bVar22 = uVar6 != 0, uVar6 = uVar6 - 1, uVar5 = -iVar2, bVar22 &&
         (uVar5 = uVar9, __s[uVar6] == 0))) {
    uVar9 = uVar9 - 1;
  }
  if (iVar2 == 1) {
    uVar9 = *__s_00;
    uVar18 = (ulong)uVar9;
    uVar6 = 0;
    for (; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
      uVar14 = __s[uVar5];
      uVar6 = uVar6 << 0x20 | (ulong)uVar14;
      if (uVar6 == 0) {
        local_278[uVar5] = 0;
LAB_00160fcf:
        uVar6 = 0;
      }
      else if (uVar6 < uVar18) {
        local_278[uVar5] = 0;
        uVar6 = (ulong)uVar14;
      }
      else {
        if (uVar6 == uVar18) {
          local_278[uVar5] = 1;
          goto LAB_00160fcf;
        }
        uVar10 = (uint)(uVar6 / uVar18);
        local_278[uVar5] = uVar10;
        uVar6 = (ulong)(uVar14 - uVar10 * uVar9);
      }
    }
    if (local_280 != (uint32_t *)0x0) {
      *local_280 = (uint32_t)uVar6;
    }
  }
  else {
    if (iVar2 == 0) {
      __assert_fail("n != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x5c9,
                    "static void llvm::APInt::divide(const WordType *, unsigned int, const WordType *, unsigned int, WordType *, WordType *)"
                   );
    }
    if (((__s_00 == local_278) || (__s == __s_00)) || (__s == local_278)) {
      __assert_fail("u != v && u != q && v != q && \"Must use different memory\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x4e0,
                    "void KnuthDiv(uint32_t *, uint32_t *, uint32_t *, uint32_t *, unsigned int, unsigned int)"
                   );
    }
    uVar6 = (ulong)(iVar2 - 1);
    uVar9 = __s_00[uVar6];
    if (uVar9 == 0) {
      uVar14 = 0x20;
    }
    else {
      uVar14 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar14 = uVar14 ^ 0x1f;
    }
    uVar18 = uVar18 & 0xffffffff;
    bVar8 = (byte)uVar14;
    if (uVar14 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      for (uVar17 = 0; uVar5 + iVar2 != uVar17; uVar17 = uVar17 + 1) {
        uVar10 = __s[uVar17];
        __s[uVar17] = uVar10 << (bVar8 & 0x1f) | uVar9;
        uVar9 = uVar10 >> (0x20 - bVar8 & 0x1f);
      }
      uVar10 = 0;
      for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        uVar16 = __s_00[uVar17];
        __s_00[uVar17] = uVar16 << (bVar8 & 0x1f) | uVar10;
        uVar10 = uVar16 >> (0x20 - bVar8 & 0x1f);
      }
    }
    __s[uVar5 + iVar2] = uVar9;
    lVar21 = (long)(int)uVar5;
    do {
      iVar3 = (int)lVar21;
      uVar5 = iVar2 + iVar3;
      uVar19 = (ulong)__s_00[uVar6];
      uVar17 = CONCAT44(__s[uVar5],__s[(iVar2 + iVar3) - 1]) / uVar19;
      uVar15 = CONCAT44(__s[uVar5],__s[(iVar2 + iVar3) - 1]) % uVar19;
      if ((uVar17 == 0x100000000) ||
         (uVar12 = (ulong)__s[uVar5 - 2] | uVar15 << 0x20, uVar7 = uVar17,
         uVar12 <= __s_00[iVar2 - 2U] * uVar17 && __s_00[iVar2 - 2U] * uVar17 - uVar12 != 0)) {
        uVar7 = uVar17 - 1;
        uVar15 = uVar15 + uVar19;
        if ((uVar15 >> 0x20 == 0) &&
           ((uVar7 == 0x100000000 ||
            (uVar15 = (ulong)__s[uVar5 - 2] | uVar15 << 0x20,
            uVar15 <= __s_00[iVar2 - 2U] * uVar7 && __s_00[iVar2 - 2U] * uVar7 - uVar15 != 0)))) {
          uVar7 = uVar17 - 2;
        }
      }
      uVar15 = 0;
      for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        uVar9 = __s_00[uVar17];
        uVar10 = iVar3 + (int)uVar17;
        lVar20 = (ulong)__s[uVar10] - (uVar15 + (uVar9 * uVar7 & 0xffffffff));
        __s[uVar10] = (uint)lVar20;
        uVar15 = (ulong)(uint)((int)(uVar9 * uVar7 >> 0x20) - (int)((ulong)lVar20 >> 0x20));
      }
      uVar9 = __s[uVar5];
      __s[uVar5] = uVar9 - (int)uVar15;
      local_278[lVar21] = (uint)uVar7;
      if (uVar9 < uVar15) {
        local_278[lVar21] = (uint)uVar7 - 1;
        uVar9 = 0;
        for (uVar17 = 0; bVar13 = (byte)uVar9, uVar18 != uVar17; uVar17 = uVar17 + 1) {
          uVar11 = iVar3 + (int)uVar17;
          uVar10 = __s_00[uVar17];
          uVar16 = __s[uVar11];
          uVar4 = uVar16;
          if (uVar10 < uVar16) {
            uVar4 = uVar10;
          }
          uVar16 = uVar9 + uVar10 + uVar16;
          __s[uVar11] = uVar16;
          uVar9 = 1;
          if (uVar4 <= uVar16) {
            uVar9 = (uint)(bVar13 & uVar16 == uVar4);
          }
        }
        __s[uVar5] = __s[uVar5] + uVar9;
      }
      bVar22 = 0 < lVar21;
      lVar21 = lVar21 + -1;
    } while (bVar22);
    if (local_280 != (uint32_t *)0x0) {
      if (uVar14 == 0) {
        for (; -1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
          local_280[uVar6] = __s[uVar6];
        }
      }
      else {
        uVar5 = 0;
        for (; -1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
          uVar9 = __s[uVar6];
          local_280[uVar6] = uVar9 >> (bVar8 & 0x1f) | uVar5;
          uVar5 = uVar9 << (0x20 - bVar8 & 0x1f);
        }
      }
    }
  }
  if (Quotient != (WordType *)0x0) {
    for (uVar6 = 0; (ulong)lhsWords * 2 != uVar6; uVar6 = uVar6 + 2) {
      *(ulong *)((long)Quotient + uVar6 * 4) =
           CONCAT44(local_278[(int)uVar6 + 1],local_278[uVar6 & 0xffffffff]);
    }
  }
  if (Remainder != (WordType *)0x0) {
    for (uVar6 = 0; (ulong)rhsWords * 2 != uVar6; uVar6 = uVar6 + 2) {
      *(ulong *)((long)Remainder + uVar6 * 4) =
           CONCAT44(local_280[(int)uVar6 + 1],local_280[uVar6 & 0xffffffff]);
    }
  }
  if (__s != SPACE) {
    operator_delete__(__s);
    operator_delete__(__s_00);
    operator_delete__(local_278);
    if (local_280 != (uint32_t *)0x0) {
      operator_delete__(local_280);
    }
  }
  return;
}

Assistant:

void APInt::divide(const WordType *LHS, unsigned lhsWords, const WordType *RHS,
                   unsigned rhsWords, WordType *Quotient, WordType *Remainder) {
  assert(lhsWords >= rhsWords && "Fractional result");

  // First, compose the values into an array of 32-bit words instead of
  // 64-bit words. This is a necessity of both the "short division" algorithm
  // and the Knuth "classical algorithm" which requires there to be native
  // operations for +, -, and * on an m bit value with an m*2 bit result. We
  // can't use 64-bit operands here because we don't have native results of
  // 128-bits. Furthermore, casting the 64-bit values to 32-bit values won't
  // work on large-endian machines.
  unsigned n = rhsWords * 2;
  unsigned m = (lhsWords * 2) - n;

  // Allocate space for the temporary values we need either on the stack, if
  // it will fit, or on the heap if it won't.
  uint32_t SPACE[128];
  uint32_t *U = nullptr;
  uint32_t *V = nullptr;
  uint32_t *Q = nullptr;
  uint32_t *R = nullptr;
  if ((Remainder?4:3)*n+2*m+1 <= 128) {
    U = &SPACE[0];
    V = &SPACE[m+n+1];
    Q = &SPACE[(m+n+1) + n];
    if (Remainder)
      R = &SPACE[(m+n+1) + n + (m+n)];
  } else {
    U = new uint32_t[m + n + 1];
    V = new uint32_t[n];
    Q = new uint32_t[m+n];
    if (Remainder)
      R = new uint32_t[n];
  }

  // Initialize the dividend
  memset(U, 0, (m+n+1)*sizeof(uint32_t));
  for (unsigned i = 0; i < lhsWords; ++i) {
    uint64_t tmp = LHS[i];
    U[i * 2] = Lo_32(tmp);
    U[i * 2 + 1] = Hi_32(tmp);
  }
  U[m+n] = 0; // this extra word is for "spill" in the Knuth algorithm.

  // Initialize the divisor
  memset(V, 0, (n)*sizeof(uint32_t));
  for (unsigned i = 0; i < rhsWords; ++i) {
    uint64_t tmp = RHS[i];
    V[i * 2] = Lo_32(tmp);
    V[i * 2 + 1] = Hi_32(tmp);
  }

  // initialize the quotient and remainder
  memset(Q, 0, (m+n) * sizeof(uint32_t));
  if (Remainder)
    memset(R, 0, n * sizeof(uint32_t));

  // Now, adjust m and n for the Knuth division. n is the number of words in
  // the divisor. m is the number of words by which the dividend exceeds the
  // divisor (i.e. m+n is the length of the dividend). These sizes must not
  // contain any zero words or the Knuth algorithm fails.
  for (unsigned i = n; i > 0 && V[i-1] == 0; i--) {
    n--;
    m++;
  }
  for (unsigned i = m+n; i > 0 && U[i-1] == 0; i--)
    m--;

  // If we're left with only a single word for the divisor, Knuth doesn't work
  // so we implement the short division algorithm here. This is much simpler
  // and faster because we are certain that we can divide a 64-bit quantity
  // by a 32-bit quantity at hardware speed and short division is simply a
  // series of such operations. This is just like doing short division but we
  // are using base 2^32 instead of base 10.
  assert(n != 0 && "Divide by zero?");
  if (n == 1) {
    uint32_t divisor = V[0];
    uint32_t remainder = 0;
    for (int i = m; i >= 0; i--) {
      uint64_t partial_dividend = Make_64(remainder, U[i]);
      if (partial_dividend == 0) {
        Q[i] = 0;
        remainder = 0;
      } else if (partial_dividend < divisor) {
        Q[i] = 0;
        remainder = Lo_32(partial_dividend);
      } else if (partial_dividend == divisor) {
        Q[i] = 1;
        remainder = 0;
      } else {
        Q[i] = Lo_32(partial_dividend / divisor);
        remainder = Lo_32(partial_dividend - (Q[i] * divisor));
      }
    }
    if (R)
      R[0] = remainder;
  } else {
    // Now we're ready to invoke the Knuth classical divide algorithm. In this
    // case n > 1.
    KnuthDiv(U, V, Q, R, m, n);
  }

  // If the caller wants the quotient
  if (Quotient) {
    for (unsigned i = 0; i < lhsWords; ++i)
      Quotient[i] = Make_64(Q[i*2+1], Q[i*2]);
  }

  // If the caller wants the remainder
  if (Remainder) {
    for (unsigned i = 0; i < rhsWords; ++i)
      Remainder[i] = Make_64(R[i*2+1], R[i*2]);
  }

  // Clean up the memory we allocated.
  if (U != &SPACE[0]) {
    delete [] U;
    delete [] V;
    delete [] Q;
    delete [] R;
  }
}